

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O3

REF_STATUS ref_migrate_replicate_ghost(REF_GRID ref_grid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar4;
  REF_STATUS RVar5;
  void *pvVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  REF_INT *local_00;
  long lVar12;
  REF_MPI ref_mpi;
  REF_INT ncell;
  REF_INT local;
  REF_INT new_cell;
  REF_INT nodes [27];
  int local_d8;
  int local_d4;
  void *local_d0;
  long local_c8;
  int local_bc;
  REF_MPI local_b8;
  REF_INT local_ac;
  REF_INT local_a8 [30];
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar4 = ref_node_synchronize_globals(ref_node);
  if (uVar4 == 0) {
    if (ref_mpi->n < 2) {
      return 0;
    }
    if ((ref_mpi->id != 0) && (0 < ref_node->old_n_global)) {
      lVar11 = 0;
      do {
        uVar4 = ref_node_add(ref_node,lVar11,&local_bc);
        if (uVar4 != 0) {
          pcVar9 = "new_node";
          uVar7 = 0x706;
          goto LAB_0020b0ae;
        }
        ref_node->part[local_bc] = 0;
        lVar11 = lVar11 + 1;
      } while (lVar11 < ref_node->old_n_global);
    }
    uVar4 = ref_node_ghost_real(ref_node);
    if (uVar4 == 0) {
      uVar4 = ref_geom_ghost(ref_grid->geom,ref_node);
      if (uVar4 == 0) {
        lVar11 = 0;
        do {
          ref_cell = ref_grid->cell[lVar11];
          if (ref_mpi->id == 0) {
            local_d8 = ref_cell->n;
            uVar4 = ref_mpi_bcast(ref_mpi,&local_d8,1,1);
            if (uVar4 != 0) {
              pcVar9 = "bcast";
              uVar7 = 0x711;
              goto LAB_0020b0ae;
            }
            uVar4 = local_d8 * ref_cell->size_per;
            if ((int)uVar4 < 0) {
              uVar7 = 0x712;
              goto LAB_0020b590;
            }
            pvVar6 = malloc((ulong)uVar4 << 3);
            if (pvVar6 == (void *)0x0) {
              uVar7 = 0x712;
              goto LAB_0020b5ba;
            }
            local_d8 = 0;
            local_c8 = lVar11;
            if (0 < ref_cell->max) {
              iVar10 = 0;
              do {
                RVar5 = ref_cell_nodes(ref_cell,iVar10,local_a8);
                if (RVar5 == 0) {
                  iVar1 = ref_cell->node_per;
                  lVar11 = (long)iVar1;
                  if (0 < lVar11) {
                    iVar2 = ref_cell->size_per;
                    lVar12 = 0;
                    do {
                      iVar3 = local_a8[lVar12];
                      lVar8 = -1;
                      if (((-1 < (long)iVar3) && (iVar3 < ref_node->max)) &&
                         (lVar8 = ref_node->global[iVar3], lVar8 < 0)) {
                        lVar8 = -1;
                      }
                      *(long *)((long)pvVar6 + lVar12 * 8 + (long)(iVar2 * local_d8) * 8) = lVar8;
                      lVar12 = lVar12 + 1;
                    } while (lVar11 != lVar12);
                  }
                  if (ref_cell->last_node_is_an_id != 0) {
                    *(long *)((long)pvVar6 + (long)(ref_cell->size_per * local_d8 + iVar1) * 8) =
                         (long)local_a8[lVar11];
                  }
                  local_d8 = local_d8 + 1;
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < ref_cell->max);
            }
            if (local_d8 != ref_cell->n) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x721,"ref_migrate_replicate_ghost","ncell miscount",(long)local_d8,
                     (long)ref_cell->n);
              return 1;
            }
            uVar4 = ref_mpi_bcast(ref_mpi,pvVar6,local_d8 * ref_cell->size_per,2);
            lVar11 = local_c8;
            if (uVar4 != 0) {
              pcVar9 = "bcast";
              uVar7 = 0x724;
              goto LAB_0020b0ae;
            }
          }
          else {
            uVar4 = ref_mpi_bcast(ref_mpi,&local_d8,1,1);
            if (uVar4 != 0) {
              pcVar9 = "bcast";
              uVar7 = 0x727;
              goto LAB_0020b0ae;
            }
            uVar4 = local_d8 * ref_cell->size_per;
            if ((int)uVar4 < 0) {
              uVar7 = 0x728;
LAB_0020b590:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,uVar7,"ref_migrate_replicate_ghost","malloc c2n of REF_GLOB negative");
              return 1;
            }
            pvVar6 = malloc((ulong)uVar4 << 3);
            if (pvVar6 == (void *)0x0) {
              uVar7 = 0x728;
LAB_0020b5ba:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,uVar7,"ref_migrate_replicate_ghost","malloc c2n of REF_GLOB NULL");
              return 2;
            }
            local_d0 = pvVar6;
            uVar4 = ref_mpi_bcast(ref_mpi,pvVar6,uVar4,2);
            if (uVar4 != 0) {
              pcVar9 = "bcast";
              uVar7 = 0x72b;
              goto LAB_0020b0ae;
            }
            pvVar6 = local_d0;
            if (0 < local_d8) {
              local_d4 = 0;
              local_c8 = lVar11;
              local_b8 = ref_mpi;
              do {
                iVar10 = ref_cell->node_per;
                if (0 < iVar10) {
                  local_00 = local_a8;
                  lVar12 = 0;
                  do {
                    uVar4 = ref_node_local(ref_node,*(REF_GLOB *)
                                                     ((long)local_d0 +
                                                     ((long)local_d4 * (long)ref_cell->size_per +
                                                     lVar12) * 8),local_00);
                    if (uVar4 != 0) {
                      pcVar9 = "g2l";
                      uVar7 = 0x732;
                      goto LAB_0020b0ae;
                    }
                    lVar12 = lVar12 + 1;
                    iVar10 = ref_cell->node_per;
                    local_00 = local_00 + 1;
                    lVar11 = local_c8;
                    ref_mpi = local_b8;
                  } while (lVar12 < iVar10);
                }
                if (ref_cell->last_node_is_an_id != 0) {
                  local_a8[iVar10] =
                       *(REF_INT *)
                        ((long)local_d0 + (long)(ref_cell->size_per * local_d4 + iVar10) * 8);
                }
                uVar4 = ref_cell_add(ref_cell,local_a8,&local_ac);
                if (uVar4 != 0) {
                  pcVar9 = "add cell";
                  uVar7 = 0x739;
                  goto LAB_0020b0ae;
                }
                local_d4 = local_d4 + 1;
                pvVar6 = local_d0;
              } while (local_d4 < local_d8);
            }
          }
          free(pvVar6);
          lVar11 = lVar11 + 1;
          if (lVar11 == 0x10) {
            return 0;
          }
        } while( true );
      }
      pcVar9 = "ghost geom";
      uVar7 = 0x70c;
    }
    else {
      pcVar9 = "ghost real";
      uVar7 = 0x70b;
    }
  }
  else {
    pcVar9 = "sync global nodes";
    uVar7 = 0x700;
  }
LAB_0020b0ae:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar7,
         "ref_migrate_replicate_ghost",(ulong)uVar4,pcVar9);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_replicate_ghost(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GLOB global;
  REF_INT local;
  REF_INT group, ncell, cell, new_cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_CELL ref_cell;
  REF_GLOB *c2n;

  RSS(ref_node_synchronize_globals(ref_node), "sync global nodes");

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  if (!ref_mpi_once(ref_mpi)) {
    for (global = 0; global < ref_node_n_global(ref_node); global++) {
      RSS(ref_node_add(ref_node, global, &local), "new_node");
      ref_node_part(ref_node, local) = 0;
    }
  }

  RSS(ref_node_ghost_real(ref_node), "ghost real");
  RSS(ref_geom_ghost(ref_grid_geom(ref_grid), ref_node), "ghost geom");

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (ref_mpi_once(ref_mpi)) {
      ncell = ref_cell_n(ref_cell);
      RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_INT_TYPE), "bcast");
      ref_malloc(c2n, ref_cell_size_per(ref_cell) * ncell, REF_GLOB);
      ncell = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
             cell_node++) {
          c2n[cell_node + ref_cell_size_per(ref_cell) * ncell] =
              ref_node_global(ref_node, nodes[cell_node]);
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          c2n[ref_cell_id_index(ref_cell) +
              ref_cell_size_per(ref_cell) * ncell] =
              (REF_GLOB)nodes[ref_cell_id_index(ref_cell)];
        }
        ncell++;
      }
      REIS(ncell, ref_cell_n(ref_cell), "ncell miscount");
      RSS(ref_mpi_bcast(ref_mpi, c2n, ncell * ref_cell_size_per(ref_cell),
                        REF_GLOB_TYPE),
          "bcast");
      ref_free(c2n);
    } else {
      RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_INT_TYPE), "bcast");
      ref_malloc(c2n, ref_cell_size_per(ref_cell) * ncell, REF_GLOB);
      RSS(ref_mpi_bcast(ref_mpi, c2n, ncell * ref_cell_size_per(ref_cell),
                        REF_GLOB_TYPE),
          "bcast");
      for (cell = 0; cell < ncell; cell++) {
        for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
             cell_node++) {
          RSS(ref_node_local(
                  ref_node, c2n[cell_node + cell * ref_cell_size_per(ref_cell)],
                  &(nodes[cell_node])),
              "g2l");
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          nodes[ref_cell_id_index(ref_cell)] =
              (REF_INT)c2n[ref_cell_id_index(ref_cell) +
                           ref_cell_size_per(ref_cell) * cell];
        }
        RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add cell");
      }
      ref_free(c2n);
    }
  }

  return REF_SUCCESS;
}